

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

Matrix3f * Matrix3f::rotateZ(Matrix3f *__return_storage_ptr__,float radians)

{
  double dVar1;
  double dVar2;
  
  dVar1 = cos((double)radians);
  dVar2 = sin((double)radians);
  __return_storage_ptr__->m_elements[0] = (float)dVar1;
  __return_storage_ptr__->m_elements[1] = (float)dVar2;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = -(float)dVar2;
  __return_storage_ptr__->m_elements[4] = (float)dVar1;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::rotateZ( float radians )
{
	float c = cos( radians );
	float s = sin( radians );

	return Matrix3f
	(
		c, -s, 0,
		s, c, 0,
		0, 0, 1
	);
}